

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterHyperDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  long lVar10;
  int i;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)(this->bestPrices).super_IdxSet.num;
  if (lVar10 < 1) {
    i = -1;
    dVar13 = -1.0;
  }
  else {
    dVar11 = *best;
    piVar7 = (this->bestPrices).super_IdxSet.idx;
    lVar10 = lVar10 + 1;
    dVar13 = -1.0;
    i = -1;
    do {
      iVar2 = piVar7[lVar10 + -2];
      dVar1 = pdVar5[iVar2];
      if (-tol <= dVar1) {
        iVar3 = (this->bestPrices).super_IdxSet.num;
        (this->bestPrices).super_IdxSet.num = iVar3 + -1;
        piVar7[lVar10 + -2] = piVar7[(long)iVar3 + -1];
        (pSVar4->isInfeasible).data[iVar2] = 0;
        dVar1 = dVar13;
      }
      else {
        dVar12 = pdVar6[iVar2];
        dVar14 = tol;
        if (tol <= dVar12) {
          dVar14 = dVar12;
        }
        dVar14 = (dVar1 * dVar1) / dVar14;
        if (dVar11 < dVar14) {
          *best = dVar14;
          dVar11 = dVar14;
          i = iVar2;
        }
        dVar1 = dVar14;
        if ((0.0 <= dVar13) && (dVar1 = dVar13, dVar14 < dVar13)) {
          dVar1 = dVar14;
        }
      }
      dVar13 = dVar1;
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  lVar10 = (long)(pSVar4->updateViols).super_IdxSet.num;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      pSVar4 = (this->super_SPxPricer<double>).thesolver;
      piVar7 = (pSVar4->isInfeasible).data;
      iVar2 = (pSVar4->updateViols).super_IdxSet.idx[lVar10 + -2];
      if (piVar7[iVar2] == 1) {
        dVar11 = pdVar5[iVar2];
        if (-tol <= dVar11) {
          piVar7[iVar2] = 0;
        }
        else {
          dVar1 = pdVar6[iVar2];
          dVar12 = tol;
          if (tol <= dVar1) {
            dVar12 = dVar1;
          }
          dVar12 = (dVar11 * dVar11) / dVar12;
          if (dVar13 < dVar12) {
            if (*best <= dVar12 && dVar12 != *best) {
              *best = dVar12;
              i = iVar2;
            }
            piVar7[iVar2] = 2;
            DIdxSet::addIdx(&this->bestPrices,iVar2);
          }
        }
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  if (i < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
    return (SPxId)DVar9;
  }
  SVar8 = SPxSolverBase<double>::coId((this->super_SPxPricer<double>).thesolver,i);
  return (SPxId)SVar8.super_DataKey;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperDim(R& best, R tol)
{
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = coTest[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}